

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O2

void brotli::BuildAndStoreHuffmanTreeFast
               (uint32_t *histogram,size_t histogram_total,size_t max_bits,uint8_t *depth,
               uint16_t *bits,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  HuffmanTree *__first;
  size_t sVar6;
  byte *pbVar7;
  uint64_t *puVar8;
  int iVar9;
  size_t sVar10;
  ulong uVar11;
  uint *puVar12;
  ulong uVar13;
  ulong uVar14;
  size_t i;
  uint uVar15;
  int iVar16;
  size_t __size;
  int iVar17;
  HuffmanTree *pHVar18;
  ulong uVar19;
  bool bVar20;
  byte local_9c;
  size_t symbols [4];
  
  symbols[2] = 0;
  symbols[3] = 0;
  symbols[0] = 0;
  symbols[1] = 0;
  __size = 8;
  sVar10 = 0;
  uVar13 = 0;
  while (histogram_total != 0) {
    uVar15 = histogram[sVar10];
    if ((ulong)uVar15 != 0) {
      if (uVar13 < 4) {
        symbols[uVar13] = sVar10;
      }
      uVar13 = uVar13 + 1;
      histogram_total = histogram_total - uVar15;
    }
    sVar10 = sVar10 + 1;
    __size = __size + 0x10;
  }
  if (uVar13 < 2) {
    uVar13 = *storage_ix;
    *(ulong *)(storage + (uVar13 >> 3)) = (ulong)storage[uVar13 >> 3] | 1L << ((byte)uVar13 & 7);
    *storage_ix = uVar13 + 4;
    sVar10 = symbols[0];
LAB_00173e20:
    WriteBits(max_bits,sVar10,storage_ix,storage);
    return;
  }
  __first = (HuffmanTree *)malloc(__size);
  uVar15 = 1;
  sVar6 = sVar10;
  pHVar18 = __first;
LAB_00173e93:
  do {
    uVar11 = sVar6 << 0x30 ^ 0xffff000100000000;
    while (bVar20 = sVar6 != 0, sVar6 = sVar6 - 1, bVar20) {
      uVar2 = histogram[sVar6];
      uVar11 = uVar11 + 0x1000000000000;
      if (uVar2 != 0) goto code_r0x00173eae;
    }
    uVar11 = (ulong)((long)pHVar18 - (long)__first) >> 3;
    std::
    __sort<brotli::HuffmanTree*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(brotli::HuffmanTree_const&,brotli::HuffmanTree_const&)>>
              (__first,pHVar18,
               (_Iter_comp_iter<bool_(*)(const_brotli::HuffmanTree_&,_const_brotli::HuffmanTree_&)>)
               0x175fb3);
    pHVar18->total_count_ = 0x7fffffff;
    pHVar18->index_left_ = -1;
    pHVar18->index_right_or_value_ = -1;
    pHVar18[1].total_count_ = 0x7fffffff;
    pHVar18[1].index_left_ = -1;
    pHVar18[1].index_right_or_value_ = -1;
    pHVar18 = pHVar18 + 2;
    iVar4 = (int)uVar11;
    iVar5 = iVar4 + 1;
    iVar9 = 0;
    for (uVar11 = uVar11 & 0xffffffff; 1 < (int)uVar11; uVar11 = (ulong)((int)uVar11 - 1)) {
      uVar3 = __first[iVar9].total_count_;
      uVar2 = __first[iVar5].total_count_;
      iVar16 = iVar9;
      if (uVar2 < uVar3) {
        iVar16 = iVar5;
      }
      iVar9 = iVar9 + (uint)(uVar3 <= uVar2);
      iVar5 = iVar5 + (uint)(uVar2 < uVar3);
      uVar3 = __first[iVar9].total_count_;
      uVar2 = __first[iVar5].total_count_;
      iVar17 = iVar9;
      if (uVar2 < uVar3) {
        iVar17 = iVar5;
      }
      iVar9 = iVar9 + (uint)(uVar3 <= uVar2);
      iVar5 = iVar5 + (uint)(uVar2 < uVar3);
      pHVar18[-1].total_count_ = __first[iVar17].total_count_ + __first[iVar16].total_count_;
      pHVar18[-1].index_left_ = (int16_t)iVar16;
      pHVar18[-1].index_right_or_value_ = (int16_t)iVar17;
      pHVar18->total_count_ = 0x7fffffff;
      pHVar18->index_left_ = -1;
      pHVar18->index_right_or_value_ = -1;
      pHVar18 = pHVar18 + 1;
    }
    SetDepth(__first + (long)(iVar4 * 2) + -1,__first,depth,'\0');
    pbVar7 = std::__max_element<unsigned_char*,__gnu_cxx::__ops::_Iter_less_iter>
                       (depth,depth + sVar10);
    uVar15 = uVar15 * 2;
    sVar6 = sVar10;
    pHVar18 = __first;
  } while (0xe < *pbVar7);
  free(__first);
  ConvertBitDepthsToSymbols(depth,sVar10,bits);
  if (uVar13 < 5) {
    uVar11 = *storage_ix;
    *(ulong *)(storage + (uVar11 >> 3)) = (ulong)storage[uVar11 >> 3] | 1L << ((byte)uVar11 & 7);
    *storage_ix = uVar11 + 2;
    WriteBits(2,uVar13 - 1,storage_ix,storage);
    uVar11 = 0;
    while (uVar19 = uVar11, sVar6 = symbols[0], uVar19 != uVar13) {
      for (uVar14 = uVar19 + 1; uVar11 = uVar19 + 1, uVar14 < uVar13; uVar14 = uVar14 + 1) {
        sVar10 = symbols[uVar14];
        if (depth[sVar10] < depth[symbols[uVar19]]) {
          symbols[uVar14] = symbols[uVar19];
          symbols[uVar19] = sVar10;
        }
      }
    }
    WriteBits(max_bits,symbols[0],storage_ix,storage);
    WriteBits(max_bits,symbols[1],storage_ix,storage);
    if (uVar13 == 2) {
      return;
    }
    sVar10 = symbols[2];
    if (uVar13 != 3) {
      WriteBits(max_bits,symbols[2],storage_ix,storage);
      WriteBits(max_bits,symbols[3],storage_ix,storage);
      sVar10 = (size_t)(depth[sVar6] == '\x01');
      max_bits = 1;
    }
    goto LAB_00173e20;
  }
  StoreStaticCodeLengthCode(storage_ix,storage);
  local_9c = 8;
  uVar13 = 0;
  do {
    while( true ) {
      if (sVar10 <= uVar13) {
        return;
      }
      bVar1 = depth[uVar13];
      uVar19 = (ulong)bVar1;
      for (uVar11 = 1;
          (uVar14 = sVar10 - uVar13, uVar13 + uVar11 < sVar10 &&
          (uVar14 = uVar11, depth[uVar11 + uVar13] == bVar1)); uVar11 = uVar11 + 1) {
      }
      uVar13 = uVar13 + uVar14;
      if (bVar1 != 0) break;
      puVar12 = (uint *)(kZeroRepsDepth + uVar14 * 4);
      puVar8 = (uint64_t *)(kZeroRepsBits + uVar14 * 8);
LAB_00174178:
      WriteBits((ulong)*puVar12,*puVar8,storage_ix,storage);
    }
    if (local_9c != bVar1) {
      WriteBits((ulong)(byte)kCodeLengthDepth[uVar19],(ulong)*(uint *)(kCodeLengthBits + uVar19 * 4)
                ,storage_ix,storage);
      uVar14 = uVar14 - 1;
    }
    local_9c = bVar1;
    if (2 < uVar14) {
      puVar12 = (uint *)(kCodeLengthBits + uVar14 * 4 + 0x44);
      puVar8 = (uint64_t *)(kNonZeroRepsDepth + uVar14 * 8 + 0xae8);
      goto LAB_00174178;
    }
    while (bVar20 = uVar14 != 0, uVar14 = uVar14 - 1, bVar20) {
      WriteBits((ulong)(byte)kCodeLengthDepth[uVar19],(ulong)*(uint *)(kCodeLengthBits + uVar19 * 4)
                ,storage_ix,storage);
    }
  } while( true );
code_r0x00173eae:
  if (uVar2 <= uVar15) {
    uVar2 = uVar15;
  }
  *pHVar18 = (HuffmanTree)(uVar2 - uVar11);
  pHVar18 = pHVar18 + 1;
  goto LAB_00173e93;
}

Assistant:

void BuildAndStoreHuffmanTreeFast(const uint32_t *histogram,
                                  const size_t histogram_total,
                                  const size_t max_bits,
                                  uint8_t* depth,
                                  uint16_t* bits,
                                  size_t* storage_ix,
                                  uint8_t* storage) {
  size_t count = 0;
  size_t symbols[4] = { 0 };
  size_t length = 0;
  size_t total = histogram_total;
  while (total != 0) {
    if (histogram[length]) {
      if (count < 4) {
        symbols[count] = length;
      }
      ++count;
      total -= histogram[length];
    }
    ++length;
  }

  if (count <= 1) {
    WriteBits(4, 1, storage_ix, storage);
    WriteBits(max_bits, symbols[0], storage_ix, storage);
    return;
  }

  const size_t max_tree_size = 2 * length + 1;
  HuffmanTree* const tree =
      static_cast<HuffmanTree*>(malloc(max_tree_size * sizeof(HuffmanTree)));
  for (uint32_t count_limit = 1; ; count_limit *= 2) {
    HuffmanTree* node = tree;
    for (size_t i = length; i != 0;) {
      --i;
      if (histogram[i]) {
        if (PREDICT_TRUE(histogram[i] >= count_limit)) {
          *node = HuffmanTree(histogram[i], -1, static_cast<int16_t>(i));
        } else {
          *node = HuffmanTree(count_limit, -1, static_cast<int16_t>(i));
        }
        ++node;
      }
    }
    const int n = static_cast<int>(node - tree);
    std::sort(tree, node, SortHuffmanTree);
    // The nodes are:
    // [0, n): the sorted leaf nodes that we start with.
    // [n]: we add a sentinel here.
    // [n + 1, 2n): new parent nodes are added here, starting from
    //              (n+1). These are naturally in ascending order.
    // [2n]: we add a sentinel at the end as well.
    // There will be (2n+1) elements at the end.
    const HuffmanTree sentinel(std::numeric_limits<int>::max(), -1, -1);
    *node++ = sentinel;
    *node++ = sentinel;

    int i = 0;      // Points to the next leaf node.
    int j = n + 1;  // Points to the next non-leaf node.
    for (int k = n - 1; k > 0; --k) {
      int left, right;
      if (tree[i].total_count_ <= tree[j].total_count_) {
        left = i;
        ++i;
      } else {
        left = j;
        ++j;
      }
      if (tree[i].total_count_ <= tree[j].total_count_) {
        right = i;
        ++i;
      } else {
        right = j;
        ++j;
      }
      // The sentinel node becomes the parent node.
      node[-1].total_count_ =
          tree[left].total_count_ + tree[right].total_count_;
      node[-1].index_left_ = static_cast<int16_t>(left);
      node[-1].index_right_or_value_ = static_cast<int16_t>(right);
      // Add back the last sentinel node.
      *node++ = sentinel;
    }
    SetDepth(tree[2 * n - 1], &tree[0], depth, 0);
    // We need to pack the Huffman tree in 14 bits.
    // If this was not successful, add fake entities to the lowest values
    // and retry.
    if (PREDICT_TRUE(*std::max_element(&depth[0], &depth[length]) <= 14)) {
      break;
    }
  }
  free(tree);
  ConvertBitDepthsToSymbols(depth, length, bits);
  if (count <= 4) {
    // value of 1 indicates a simple Huffman code
    WriteBits(2, 1, storage_ix, storage);
    WriteBits(2, count - 1, storage_ix, storage);  // NSYM - 1

    // Sort
    for (size_t i = 0; i < count; i++) {
      for (size_t j = i + 1; j < count; j++) {
        if (depth[symbols[j]] < depth[symbols[i]]) {
          std::swap(symbols[j], symbols[i]);
        }
      }
    }

    if (count == 2) {
      WriteBits(max_bits, symbols[0], storage_ix, storage);
      WriteBits(max_bits, symbols[1], storage_ix, storage);
    } else if (count == 3) {
      WriteBits(max_bits, symbols[0], storage_ix, storage);
      WriteBits(max_bits, symbols[1], storage_ix, storage);
      WriteBits(max_bits, symbols[2], storage_ix, storage);
    } else {
      WriteBits(max_bits, symbols[0], storage_ix, storage);
      WriteBits(max_bits, symbols[1], storage_ix, storage);
      WriteBits(max_bits, symbols[2], storage_ix, storage);
      WriteBits(max_bits, symbols[3], storage_ix, storage);
      // tree-select
      WriteBits(1, depth[symbols[0]] == 1 ? 1 : 0, storage_ix, storage);
    }
  } else {
    // Complex Huffman Tree
    StoreStaticCodeLengthCode(storage_ix, storage);

    // Actual rle coding.
    uint8_t previous_value = 8;
    for (size_t i = 0; i < length;) {
      const uint8_t value = depth[i];
      size_t reps = 1;
      for (size_t k = i + 1; k < length && depth[k] == value; ++k) {
        ++reps;
      }
      i += reps;
      if (value == 0) {
        WriteBits(kZeroRepsDepth[reps], kZeroRepsBits[reps],
                  storage_ix, storage);
      } else {
        if (previous_value != value) {
          WriteBits(kCodeLengthDepth[value], kCodeLengthBits[value],
                    storage_ix, storage);
          --reps;
        }
        if (reps < 3) {
          while (reps != 0) {
            reps--;
            WriteBits(kCodeLengthDepth[value], kCodeLengthBits[value],
                      storage_ix, storage);
          }
        } else {
          reps -= 3;
          WriteBits(kNonZeroRepsDepth[reps], kNonZeroRepsBits[reps],
                    storage_ix, storage);
        }
        previous_value = value;
      }
    }
  }
}